

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viterbi.cpp
# Opt level: O2

bool MeCab::Viterbi::initNBest(Lattice *lattice)

{
  int iVar1;
  undefined4 extraout_var;
  NBestGenerator *this;
  
  iVar1 = (*lattice->_vptr_Lattice[0x12])(lattice,2);
  if ((char)iVar1 != '\0') {
    iVar1 = (*lattice->_vptr_Lattice[0x16])(lattice);
    this = Allocator<mecab_node_t,_mecab_path_t>::nbest_generator
                     ((Allocator<mecab_node_t,_mecab_path_t> *)CONCAT44(extraout_var,iVar1));
    NBestGenerator::set(this,lattice);
  }
  return true;
}

Assistant:

bool Viterbi::initNBest(Lattice *lattice) {
  if (!lattice->has_request_type(MECAB_NBEST)) {
    return true;
  }
  lattice->allocator()->nbest_generator()->set(lattice);
  return true;
}